

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1c5214::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  EImageType in_ECX;
  byte in_R8B;
  Array2D<Imath_3_2::half> lPixelsLeft;
  Array2D<Imath_3_2::half> lPixels;
  int lNbChannels;
  Compression in_stack_000000b0;
  int in_stack_000000b4;
  Array2D<Imath_3_2::half> *in_stack_000000b8;
  int *in_stack_000000c0;
  int *in_stack_000000c8;
  char *in_stack_000000d0;
  int in_stack_000001ac;
  Array2D<Imath_3_2::half> *in_stack_000001b0;
  Array2D<Imath_3_2::half> *in_stack_000001b8;
  int *in_stack_000001c0;
  int *in_stack_000001c8;
  char *in_stack_000001d0;
  Compression in_stack_000001e0;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff90;
  Array2D<Imath_3_2::half> *this;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffffb0;
  Array2D<Imath_3_2::half> local_38;
  int local_20;
  byte local_15;
  
  local_15 = in_R8B & 1;
  local_20 = getNbChannels(in_ECX);
  this = &local_38;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(this);
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            (in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,
             (long)in_stack_ffffffffffffffa0);
  fillPixels((int *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  if ((local_15 & 1) == 0) {
    writePixels(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                in_stack_000000b4,in_stack_000000b0);
  }
  else {
    Imf_3_2::Array2D<Imath_3_2::half>::Array2D((Array2D<Imath_3_2::half> *)&stack0xffffffffffffffa0)
    ;
    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
              (in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,
               (long)in_stack_ffffffffffffffa0);
    fillPixels((int *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               (int)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
    writePixels(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                in_stack_000001b0,in_stack_000001ac,in_stack_000001e0);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffff90);
  }
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
writeFile (
    const char  pFilename[],
    int         pHeight,
    int         pWidth,
    EImageType  pImageType,
    bool        pIsStereo,
    Compression pCompression)
{
    const int     lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);

        writePixels (
            pFilename,
            pHeight,
            pWidth,
            lPixels,
            lPixelsLeft,
            lNbChannels,
            pCompression);
    }
    else
    {
        writePixels (
            pFilename, pHeight, pWidth, lPixels, lNbChannels, pCompression);
    }
}